

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

char * cppcms_capi_error_message(cppcms_capi_object obj)

{
  cppcms_capi_exception *e;
  cppcms_capi_object obj_local;
  char *local_8;
  
  if (obj == (cppcms_capi_object)0x0) {
    local_8 = "ok";
  }
  else if (*obj == 0) {
    local_8 = "ok";
  }
  else {
    local_8 = *(char **)((long)obj + 8);
  }
  return local_8;
}

Assistant:

char const *cppcms_capi_error_message(cppcms_capi_object obj)
{
	if(!obj)
		return "ok";
	cppcms_capi_exception *e=static_cast<cppcms_capi_exception *>(obj);
	if(e->code == 0)
		return "ok";
	else
		return e->msg;
}